

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2_provider.hpp
# Opt level: O2

void __thiscall
digestpp::detail::sha2_provider<unsigned_long,_0UL>::transform
          (sha2_provider<unsigned_long,_0UL> *this,uchar *data,size_t num_blks)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  long lVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  unsigned_long uVar21;
  unsigned_long W [80];
  unsigned_long local_388;
  ulong auStack_338 [16];
  ulong auStack_2b8 [81];
  
  uVar19 = (this->H)._M_elems[0];
  uVar5 = (this->H)._M_elems[1];
  uVar13 = (this->H)._M_elems[2];
  uVar6 = (this->H)._M_elems[3];
  uVar10 = (this->H)._M_elems[4];
  uVar11 = (this->H)._M_elems[5];
  uVar7 = (this->H)._M_elems[6];
  local_388 = (this->H)._M_elems[7];
  for (sVar8 = 0; sVar8 != num_blks; sVar8 = sVar8 + 1) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      uVar1 = *(ulong *)(data + lVar4 * 8);
      auStack_338[lVar4] =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    }
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      auStack_338[lVar4 + 0x10] = auStack_338[lVar4];
    }
    for (lVar4 = 0x10; lVar4 != 0x50; lVar4 = lVar4 + 1) {
      uVar1 = auStack_338[lVar4 + 0xe];
      uVar2 = auStack_338[lVar4 + 1];
      auStack_338[lVar4 + 0x10] =
           (uVar1 >> 6 ^ (uVar1 << 3 | uVar1 >> 0x3d) ^ (uVar1 << 0x2d | uVar1 >> 0x13)) +
           auStack_338[lVar4 + 9] + auStack_338[lVar4] +
           (uVar2 >> 7 ^
           (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
    }
    uVar1 = uVar5;
    uVar2 = uVar10;
    uVar14 = uVar19;
    uVar15 = uVar6;
    uVar3 = uVar7;
    uVar17 = uVar13;
    uVar20 = local_388;
    uVar21 = uVar11;
    for (lVar4 = 0; uVar16 = uVar3, uVar12 = uVar2, uVar9 = uVar1, lVar4 != 0x280; lVar4 = lVar4 + 8
        ) {
      lVar18 = (uVar21 & uVar12) + uVar20 + (~uVar12 & uVar16) +
               ((uVar12 << 0x17 | uVar12 >> 0x29) ^
               (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe)) +
               *(long *)((long)&sha512_constants<void>::K + lVar4) +
               *(long *)((long)auStack_338 + lVar4 + 0x80);
      uVar1 = uVar14;
      uVar2 = uVar15 + lVar18;
      uVar14 = (uVar17 & uVar9 ^ (uVar17 ^ uVar9) & uVar14) +
               ((uVar14 << 0x19 | uVar14 >> 0x27) ^
               (uVar14 << 0x1e | uVar14 >> 0x22) ^ (uVar14 << 0x24 | uVar14 >> 0x1c)) + lVar18;
      uVar15 = uVar17;
      uVar3 = uVar21;
      uVar17 = uVar9;
      uVar20 = uVar16;
      uVar21 = uVar12;
    }
    uVar19 = uVar19 + uVar14;
    uVar5 = uVar5 + uVar9;
    uVar13 = uVar13 + uVar17;
    uVar6 = uVar6 + uVar15;
    uVar10 = uVar10 + uVar12;
    uVar11 = uVar11 + uVar21;
    uVar7 = uVar7 + uVar16;
    local_388 = local_388 + uVar20;
    (this->H)._M_elems[0] = uVar19;
    (this->H)._M_elems[1] = uVar5;
    (this->H)._M_elems[2] = uVar13;
    (this->H)._M_elems[3] = uVar6;
    (this->H)._M_elems[4] = uVar10;
    (this->H)._M_elems[5] = uVar11;
    (this->H)._M_elems[6] = uVar7;
    (this->H)._M_elems[7] = local_388;
    data = data + 0x80;
  }
  return;
}

Assistant:

inline void transform(const unsigned char* data, size_t num_blks)
	{
		for (size_t blk = 0; blk < num_blks; blk++)
		{
			T M[16];
			for (int i = 0; i < 16; i++)
				M[i] = byteswap(reinterpret_cast<const T*>(data)[blk * 16 + i]);

			const int rounds = N == 512 ? 80 : 64;
			T W[rounds];
			for (int t = 0; t <= 15; t++)
				W[t] = M[t];
			for (int t = 16; t < rounds; t++)
				W[t] = sha2_functions::sigma1(W[t - 2]) + W[t - 7] + sha2_functions::sigma0(W[t - 15]) + W[t - 16];

			T a = H[0];
			T b = H[1];
			T c = H[2];
			T d = H[3];
			T e = H[4];
			T f = H[5];
			T g = H[6];
			T h = H[7];

			for (int t = 0; t < rounds; t++)
			{
				T T1 = h + sha2_functions::sum1(e) + sha2_functions::Ch(e, f, g) + getK(t) + W[t];
				T T2 = sha2_functions::sum0(a) + sha2_functions::Maj(a, b, c);
				h = g;
				g = f;
				f = e;
				e = d + T1;
				d = c;
				c = b;
				b = a;
				a = T1 + T2;

			}
			H[0] += a;
			H[1] += b;
			H[2] += c;
			H[3] += d;
			H[4] += e;
			H[5] += f;
			H[6] += g;
			H[7] += h;
		}

	}